

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmem.c
# Opt level: O0

void * luaM_realloc_(lua_State *L,void *block,size_t osize,size_t nsize)

{
  global_State *pgVar1;
  global_State *g;
  void *newblock;
  size_t nsize_local;
  size_t osize_local;
  void *block_local;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  g = (global_State *)(*pgVar1->frealloc)(pgVar1->ud,block,osize,nsize);
  if ((g == (global_State *)0x0 && nsize != 0) &&
     (g = (global_State *)tryagain(L,block,osize,nsize), g == (global_State *)0x0)) {
    L_local = (lua_State *)0x0;
  }
  else {
    pgVar1->GCdebt = (pgVar1->GCdebt + nsize) - osize;
    L_local = (lua_State *)g;
  }
  return L_local;
}

Assistant:

void *luaM_realloc_ (lua_State *L, void *block, size_t osize, size_t nsize) {
  void *newblock;
  global_State *g = G(L);
  lua_assert((osize == 0) == (block == NULL));
  newblock = firsttry(g, block, osize, nsize);
  if (l_unlikely(newblock == NULL && nsize > 0)) {
    newblock = tryagain(L, block, osize, nsize);
    if (newblock == NULL)  /* still no memory? */
      return NULL;  /* do not update 'GCdebt' */
  }
  lua_assert((nsize == 0) == (newblock == NULL));
  g->GCdebt = (g->GCdebt + nsize) - osize;
  return newblock;
}